

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb_fgets(char *buffer,int buflen,FILE *f)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  
  *buffer = '\0';
  __s = fgets(buffer,buflen,(FILE *)f);
  if (__s != (char *)0x0) {
    sVar2 = strlen(__s);
    uVar1 = (int)sVar2 - 1;
    if ((-1 < (int)uVar1) && (__s[uVar1] == '\n')) {
      __s[uVar1] = '\0';
    }
  }
  return __s;
}

Assistant:

char * stb_fgets(char *buffer, int buflen, FILE *f)
{
   char *p;
   buffer[0] = 0;
   p = fgets(buffer, buflen, f);
   if (p) {
      int n = strlen(p)-1;
      if (n >= 0)
         if (p[n] == '\n')
            p[n] = 0;
   }
   return p;
}